

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.h
# Opt level: O1

int CTcSrcFile::ucs_str_starts_with(char *ustr,size_t ulen,char *astr,int big_endian,int case_fold)

{
  int iVar1;
  
  if (1 < ulen) {
    do {
      if (*astr == '\0') break;
      iVar1 = ucs_char_eq(ustr,*astr,big_endian,case_fold);
      if (iVar1 == 0) {
        return 0;
      }
      ustr = ustr + 2;
      ulen = ulen - 2;
      astr = astr + 1;
    } while (1 < ulen);
  }
  return (uint)(*astr == '\0');
}

Assistant:

static int ucs_str_starts_with(const char *ustr, size_t ulen,
                                   const char *astr,
                                   int big_endian, int case_fold)
    {
        /* compare each character of the unicode string to the ascii string */
        for ( ; ulen >= 2 && *astr != '\0' ; ustr += 2, ulen -= 2, ++astr)
        {
            /* if the characters don't match, we don't have a match */
            if (!ucs_char_eq(ustr, *astr, big_endian, case_fold))
                return FALSE;
        }

        /* 
         *   if we reached the end of the ASCII string, we have a match;
         *   otherwise, we ran out of the Unicode string before we ran out of
         *   the ASCII string, so we don't have a match 
         */
        return (*astr == 0);
    }